

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

uint HUF_optimalTableLog(uint maxTableLog,size_t srcSize,uint maxSymbolValue,void *workSpace,
                        size_t wkspSize,HUF_CElt *table,uint *count,int flags)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint local_64;
  ulong local_60;
  
  if (srcSize < 2) {
    __assert_fail("srcSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x4e0,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if (wkspSize < 0x1300) {
    __assert_fail("wkspSize >= sizeof(HUF_buildCTable_wksp_tables)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                  ,0x4e1,
                  "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
                 );
  }
  if ((flags & 2U) == 0) {
    uVar1 = FSE_optimalTableLog_internal(maxTableLog,srcSize,maxSymbolValue,1);
    return uVar1;
  }
  uVar1 = HUF_cardinality(count,maxSymbolValue);
  uVar2 = HUF_minTableLog(uVar1);
  local_60 = 0xfffffffffffffffe;
  local_64 = maxTableLog;
  for (uVar1 = uVar2; uVar1 <= maxTableLog; uVar1 = uVar1 + 1) {
    sVar3 = HUF_buildCTable_wksp(table,count,maxSymbolValue,uVar1,workSpace,wkspSize);
    if (sVar3 < 0xffffffffffffff89) {
      if (sVar3 < uVar1 && uVar2 < uVar1) break;
      sVar3 = HUF_writeCTable_wksp
                        ((void *)((long)workSpace + 0x2ec),wkspSize - 0x2ec,table,maxSymbolValue,
                         (uint)sVar3,workSpace,wkspSize);
      if (sVar3 < 0xffffffffffffff89) {
        sVar4 = HUF_estimateCompressedSize(table,count,maxSymbolValue);
        uVar5 = sVar4 + sVar3;
        if (local_60 + 1 < uVar5) break;
        if (uVar5 < local_60) {
          local_64 = uVar1;
          local_60 = uVar5;
        }
      }
    }
  }
  if (local_64 < 0xd) {
    return local_64;
  }
  __assert_fail("optLog <= HUF_TABLELOG_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/huf_compress.c"
                ,0x509,
                "unsigned int HUF_optimalTableLog(unsigned int, size_t, unsigned int, void *, size_t, HUF_CElt *, const unsigned int *, int)"
               );
}

Assistant:

unsigned HUF_optimalTableLog(
            unsigned maxTableLog,
            size_t srcSize,
            unsigned maxSymbolValue,
            void* workSpace, size_t wkspSize,
            HUF_CElt* table,
      const unsigned* count,
            int flags)
{
    assert(srcSize > 1); /* Not supported, RLE should be used instead */
    assert(wkspSize >= sizeof(HUF_buildCTable_wksp_tables));

    if (!(flags & HUF_flags_optimalDepth)) {
        /* cheap evaluation, based on FSE */
        return FSE_optimalTableLog_internal(maxTableLog, srcSize, maxSymbolValue, 1);
    }

    {   BYTE* dst = (BYTE*)workSpace + sizeof(HUF_WriteCTableWksp);
        size_t dstSize = wkspSize - sizeof(HUF_WriteCTableWksp);
        size_t maxBits, hSize, newSize;
        const unsigned symbolCardinality = HUF_cardinality(count, maxSymbolValue);
        const unsigned minTableLog = HUF_minTableLog(symbolCardinality);
        size_t optSize = ((size_t) ~0) - 1;
        unsigned optLog = maxTableLog, optLogGuess;

        DEBUGLOG(6, "HUF_optimalTableLog: probing huf depth (srcSize=%zu)", srcSize);

        /* Search until size increases */
        for (optLogGuess = minTableLog; optLogGuess <= maxTableLog; optLogGuess++) {
            DEBUGLOG(7, "checking for huffLog=%u", optLogGuess);
            maxBits = HUF_buildCTable_wksp(table, count, maxSymbolValue, optLogGuess, workSpace, wkspSize);
            if (ERR_isError(maxBits)) continue;

            if (maxBits < optLogGuess && optLogGuess > minTableLog) break;

            hSize = HUF_writeCTable_wksp(dst, dstSize, table, maxSymbolValue, (U32)maxBits, workSpace, wkspSize);

            if (ERR_isError(hSize)) continue;

            newSize = HUF_estimateCompressedSize(table, count, maxSymbolValue) + hSize;

            if (newSize > optSize + 1) {
                break;
            }

            if (newSize < optSize) {
                optSize = newSize;
                optLog = optLogGuess;
            }
        }
        assert(optLog <= HUF_TABLELOG_MAX);
        return optLog;
    }
}